

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

EntryType * __thiscall
JsUtil::
BaseDictionary<void_*,_void_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
::AllocateEntries(BaseDictionary<void_*,_void_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                  *this,int size,bool zeroAllocate)

{
  Recycler *this_00;
  EntryType *pEVar1;
  code *AllocFunc;
  size_t sVar2;
  size_t byteSize;
  size_t sVar3;
  undefined1 local_40 [8];
  TrackAllocData data;
  
  local_40 = (undefined1  [8])
             &SimpleHashedEntry<Memory::WriteBarrierPtr<void>,Memory::WriteBarrierPtr<void>>::
              typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_136c13;
  data.filename._0_4_ = 0x453;
  data.plusSize = (long)size;
  this_00 = Memory::Recycler::TrackAllocInfo(this->alloc,(TrackAllocData *)local_40);
  if (size == 0) {
    Memory::Recycler::ClearTrackAllocInfo(this_00,(TrackAllocData *)0x0);
    pEVar1 = (EntryType *)&DAT_00000008;
  }
  else {
    if (zeroAllocate) {
      AllocFunc = Memory::Recycler::AllocZeroWithBarrier;
    }
    else {
      AllocFunc = Memory::Recycler::AllocWithBarrier;
    }
    sVar2 = (long)size << 4;
    byteSize = 0xffffffffffffffff;
    if (-1 < size) {
      byteSize = sVar2;
    }
    sVar3 = 0;
    pEVar1 = (EntryType *)
             new__<Memory::Recycler>(byteSize,this_00,(offset_in_Recycler_to_subr)AllocFunc);
    do {
      *(undefined8 *)
       ((long)&(pEVar1->
               super_DefaultHashedEntry<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
               ).
               super_ImplicitKeyValueEntry<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>
               .
               super_ValueEntry<Memory::WriteBarrierPtr<void>,_JsUtil::(anonymous_namespace)::ValueEntryData<Memory::WriteBarrierPtr<void>_>_>
               .super_ValueEntryData<Memory::WriteBarrierPtr<void>_>.value.ptr + sVar3) = 0;
      sVar3 = sVar3 + 0x10;
    } while (sVar2 != sVar3);
  }
  return pEVar1;
}

Assistant:

EntryType * AllocateEntries(DECLSPEC_GUARD_OVERFLOW int size, const bool zeroAllocate = true)
        {
            // Note that the choice of leaf/non-leaf node is decided for the EntryType on the basis of TValue. By default, if
            // TValue is a pointer, a non-leaf allocation is done. This behavior can be overridden by specializing
            // TypeAllocatorFunc for TValue.
            return
                AllocateArray<AllocatorType, EntryType, false>(
                    TRACK_ALLOC_INFO(alloc, EntryType, AllocatorType, 0, size),
                    zeroAllocate ? EntryAllocatorFuncType::GetAllocZeroFunc() : EntryAllocatorFuncType::GetAllocFunc(),
                    size);
        }